

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidgetPrivate::setWidget_helper
          (QGraphicsProxyWidgetPrivate *this,QWidget *newWidget,bool autoShow)

{
  QPointer<QWidget> *pQVar1;
  QGraphicsItem **ppQVar2;
  QGraphicsItem *pQVar3;
  Data *pDVar4;
  QGraphicsItem *pQVar5;
  QGraphicsProxyWidgetPrivate *this_00;
  long lVar6;
  QMarginsF margins;
  int *piVar7;
  bool bVar8;
  int iVar9;
  LayoutDirection direction;
  QWExtra *pQVar10;
  Data *pDVar11;
  QStyle *style;
  QSize QVar12;
  QWidget *pQVar13;
  QObject *pQVar14;
  QObject *pQVar15;
  char *pcVar16;
  QObject *pQVar17;
  QGraphicsItem **ppQVar18;
  QGraphicsItem *pQVar19;
  QGraphicsItem *this_01;
  long in_FS_OFFSET;
  QMargins QVar20;
  QObject local_a0 [8];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  char *pcStack_60;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pDVar4 = (this->widget).wp.d;
  this_01 = pQVar3 + -1;
  if (pQVar3 == (QGraphicsItem *)0x0) {
    this_01 = (QGraphicsItem *)0x0;
  }
  if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
    pQVar13 = (QWidget *)0x0;
  }
  else {
    pQVar13 = (QWidget *)(this->widget).wp.value;
  }
  if (pQVar13 != newWidget) {
    if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
       ((this->widget).wp.value != (QObject *)0x0)) {
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar14 = (QObject *)0x0;
      }
      else {
        pQVar14 = (this->widget).wp.value;
      }
      pQVar1 = &this->widget;
      QObject::disconnect(pQVar14,"2destroyed()",(QObject *)this_01,"1_q_removeWidgetSlot()");
      QObject::removeEventFilter((this->widget).wp.value);
      QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_DontShowOnScreen,false);
      *(undefined8 *)(*(long *)(*(long *)((this->widget).wp.value + 8) + 0x78) + 0x10) = 0;
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [5])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
      (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [6])(this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
      QWidget::update((QWidget *)(this->widget).wp.value);
      pQVar3 = this_01 + 1;
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsItem::childItems(&local_58,pQVar3);
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        ppQVar2 = local_58.d.ptr + local_58.d.size;
        ppQVar18 = local_58.d.ptr;
        do {
          pQVar5 = *ppQVar18;
          iVar9 = (*((pQVar5->d_ptr).d)->_vptr_QGraphicsItemPrivate[7])();
          if ((char)iVar9 != '\0') {
            pQVar19 = pQVar5 + -1;
            if (pQVar5 == (QGraphicsItem *)0x0) {
              pQVar19 = (QGraphicsItem *)0x0;
            }
            this_00 = (QGraphicsProxyWidgetPrivate *)pQVar19[1].d_ptr.d;
            pDVar4 = (this_00->widget).wp.d;
            if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
              pQVar14 = (QObject *)0x0;
            }
            else {
              pQVar14 = (this_00->widget).wp.value;
            }
            pDVar11 = (this->widget).wp.d;
            do {
              pQVar15 = pQVar14;
              if ((pQVar15 == (QObject *)0x0) ||
                 (*(QObject **)(*(long *)(pQVar15 + 8) + 0x10) == (QObject *)0x0)) break;
              if (pDVar11 == (Data *)0x0) {
                pQVar17 = (QObject *)0x0;
              }
              else {
                pQVar17 = (this->widget).wp.value;
                if (*(int *)(pDVar11 + 4) == 0) {
                  pQVar17 = (QObject *)0x0;
                }
              }
              pQVar14 = *(QObject **)(*(long *)(pQVar15 + 8) + 0x10);
            } while (pQVar17 != pQVar15);
            if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
               ((this_00->widget).wp.value != (QObject *)0x0)) {
              pDVar4 = (pQVar1->wp).d;
              if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
                pQVar14 = (QObject *)0x0;
              }
              else {
                pQVar14 = (this->widget).wp.value;
              }
              if (pQVar14 == pQVar15) {
                setWidget_helper(this_00,(QWidget *)0x0,true);
                (*pQVar19->_vptr_QGraphicsItem[4])(pQVar19);
              }
            }
          }
          ppQVar18 = ppQVar18 + 1;
        } while (ppQVar18 != ppQVar2);
      }
      pDVar4 = (pQVar1->wp).d;
      (pQVar1->wp).d = (Data *)0x0;
      (this->widget).wp.value = (QObject *)0x0;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar4 = *(int *)pDVar4 + -1;
        UNLOCK();
        if (*(int *)pDVar4 == 0) {
          operator_delete(pDVar4);
        }
      }
      QGraphicsItem::unsetCursor(pQVar3);
      QGraphicsItem::setAcceptHoverEvents(pQVar3,false);
      if (newWidget == (QWidget *)0x0) {
        local_68._0_1_ = (QPaintDevice)0x0;
        local_68._1_3_ = 0;
        uStack_64 = 0;
        pcStack_60 = (char *)0x0;
        local_78._0_4_ = 0;
        local_78._4_4_ = 0;
        local_78._8_4_ = 0;
        uStack_6c = 0;
        QGraphicsItem::update(pQVar3,(QRectF *)local_78);
      }
      if ((QWidgetData *)local_58.d.d != (QWidgetData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    if (newWidget != (QWidget *)0x0) {
      if ((((newWidget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
         ((lVar6 = *(long *)(*(long *)(*(long *)(*(long *)&newWidget->field_0x8 + 0x10) + 8) + 0x78)
          , lVar6 == 0 || (*(long *)(lVar6 + 0x10) == 0)))) {
        pcVar16 = 
        "QGraphicsProxyWidget::setWidget: cannot embed widget %p which is not a toplevel widget, and is not a child of an embedded widget"
        ;
      }
      else {
        pQVar10 = ((*(QWidgetPrivate **)&newWidget->field_0x8)->extra)._M_t.
                  super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                  super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                  super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if (pQVar10 == (QWExtra *)0x0) {
          QWidgetPrivate::createExtra(*(QWidgetPrivate **)&newWidget->field_0x8);
          pQVar10 = *(QWExtra **)(*(long *)&newWidget->field_0x8 + 0x78);
        }
        if ((QGraphicsItem *)pQVar10->proxyWidget == (QGraphicsItem *)0x0) {
          pQVar10->proxyWidget = (QGraphicsProxyWidget *)this_01;
          QWidget::setAttribute(newWidget,WA_DontShowOnScreen,true);
          QWidget::ensurePolished(newWidget);
          QWidget::setAttribute(newWidget,WA_QuitOnClose,false);
          pQVar3 = this_01 + 1;
          QGraphicsItem::setAcceptHoverEvents(pQVar3,true);
          if ((newWidget->data->widget_attributes & 0x200) != 0) {
            QGraphicsWidget::setAttribute((QGraphicsWidget *)this_01,WA_NoSystemBackground,true);
          }
          if ((newWidget->data->widget_attributes & 0x10) != 0) {
            QGraphicsWidget::setAttribute((QGraphicsWidget *)this_01,WA_OpaquePaintEvent,true);
          }
          pDVar11 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                      (&newWidget->super_QObject);
          pDVar4 = (this->widget).wp.d;
          (this->widget).wp.d = pDVar11;
          (this->widget).wp.value = &newWidget->super_QObject;
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            *(int *)pDVar4 = *(int *)pDVar4 + -1;
            UNLOCK();
            if (*(int *)pDVar4 == 0) {
              operator_delete(pDVar4);
            }
          }
          this->field_0x244 = 0xaa;
          if (((autoShow) &&
              (bVar8 = QWidget::testAttribute_helper(newWidget,WA_WState_ExplicitShowHide), !bVar8))
             || ((newWidget->data->widget_attributes & 0x10000) == 0)) {
            QWidget::show(newWidget);
          }
          bVar8 = QWidget::testAttribute_helper(newWidget,WA_SetCursor);
          if (bVar8) {
            QWidget::cursor((QWidget *)local_78);
            QGraphicsItem::setCursor(pQVar3,(QCursor *)local_78);
            QCursor::~QCursor((QCursor *)local_78);
          }
          QGraphicsItem::setEnabled(pQVar3,(newWidget->data->widget_attributes & 1) == 0);
          QGraphicsItem::setVisible
                    (pQVar3,SUB21((ushort)(short)newWidget->data->widget_attributes >> 0xf,0));
          direction = QWidget::layoutDirection(newWidget);
          QGraphicsWidget::setLayoutDirection((QGraphicsWidget *)this_01,direction);
          bVar8 = QWidget::testAttribute_helper(newWidget,WA_SetStyle);
          if (bVar8) {
            style = QWidget::style((QWidget *)(this->widget).wp.value);
            QGraphicsWidget::setStyle((QGraphicsWidget *)this_01,style);
          }
          (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.
            _vptr_QGraphicsItemPrivate[5])
                    (this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
          (*(this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.
            _vptr_QGraphicsItemPrivate[6])
                    (this,(ulong)(this->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
          bVar8 = QWidget::testAttribute_helper(newWidget,WA_Resized);
          if (!bVar8) {
            QWidget::adjustSize(newWidget);
          }
          QVar20 = QWidget::contentsMargins(newWidget);
          local_98 = (double)QVar20.m_left.m_i.m_i;
          dStack_90 = (double)QVar20.m_top.m_i.m_i;
          local_88 = (double)QVar20.m_right.m_i.m_i;
          dStack_80 = (double)QVar20.m_bottom.m_i.m_i;
          margins.m_top = dStack_90;
          margins.m_left = local_98;
          margins.m_right = local_88;
          margins.m_bottom = dStack_80;
          QGraphicsWidget::setContentsMargins((QGraphicsWidget *)this_01,margins);
          QWidget::windowTitle((QString *)local_78,newWidget);
          QGraphicsWidget::setWindowTitle((QGraphicsWidget *)this_01,(QString *)local_78);
          piVar7 = (int *)CONCAT44(local_78._4_4_,local_78._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_),2,0x10);
            }
          }
          pQVar3 = this_01 + 2;
          local_78._0_4_ = QWidget::sizePolicy(newWidget);
          QGraphicsLayoutItem::setSizePolicy((QGraphicsLayoutItem *)pQVar3,(QSizePolicy *)local_78);
          QVar12 = QWidget::minimumSize(newWidget);
          if ((ulong)QVar12 >> 0x20 == 0 && QVar12.wd.m_i.m_i == 0) {
            local_78._0_8_ = (Data *)0xbff0000000000000;
            unique0x100009e9 = (char16_t *)0xbff0000000000000;
          }
          else {
            local_78._0_8_ = (undefined8)QVar12.wd.m_i.m_i;
            unique0x10000486 = (char16_t *)(double)QVar12.ht.m_i.m_i;
          }
          QGraphicsLayoutItem::setMinimumSize((QGraphicsLayoutItem *)pQVar3,(QSizeF *)local_78);
          QVar12 = QWidget::maximumSize(newWidget);
          if ((ulong)QVar12 >> 0x20 == 0 && QVar12.wd.m_i.m_i == 0) {
            local_78._0_8_ = (Data *)0xbff0000000000000;
            unique0x10000a09 = (char16_t *)0xbff0000000000000;
          }
          else {
            local_78._0_8_ = (undefined8)QVar12.wd.m_i.m_i;
            unique0x1000049e = (char16_t *)(double)QVar12.ht.m_i.m_i;
          }
          QGraphicsLayoutItem::setMaximumSize((QGraphicsLayoutItem *)pQVar3,(QSizeF *)local_78);
          updateProxyGeometryFromWidget(this);
          updateProxyInputMethodAcceptanceFromWidget(this);
          QObject::installEventFilter(&newWidget->super_QObject);
          QObject::connect(local_a0,(char *)newWidget,(QObject *)"2destroyed()",(char *)this_01,
                           0x7021b1);
          QMetaObject::Connection::~Connection((Connection *)local_a0);
          this->field_0x244 = 0;
          goto LAB_006076dd;
        }
        if ((QGraphicsItem *)pQVar10->proxyWidget == this_01) goto LAB_006076dd;
        pcVar16 = "QGraphicsProxyWidget::setWidget: cannot embed widget %p; already embedded";
      }
      pcStack_60 = "default";
      uStack_64 = 0;
      local_68._0_1_ = (QPaintDevice)0x0;
      local_68._1_3_ = 0;
      uStack_6c = 0;
      local_78._8_4_ = 0;
      local_78._4_4_ = 0;
      local_78._0_4_ = 2;
      QMessageLogger::warning(local_78,pcVar16,newWidget);
    }
  }
LAB_006076dd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::setWidget_helper(QWidget *newWidget, bool autoShow)
{
    Q_Q(QGraphicsProxyWidget);
    if (newWidget == widget)
        return;
    if (widget) {
        QObject::disconnect(widget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));
        widget->removeEventFilter(q);
        widget->setAttribute(Qt::WA_DontShowOnScreen, false);
        widget->d_func()->extra->proxyWidget = nullptr;
        resolveFont(inheritedFontResolveMask);
        resolvePalette(inheritedPaletteResolveMask);
        widget->update();

        const auto childItems = q->childItems();
        for (QGraphicsItem *child : childItems) {
            if (child->d_ptr->isProxyWidget()) {
                QGraphicsProxyWidget *childProxy = static_cast<QGraphicsProxyWidget *>(child);
                QWidget *parent = childProxy->widget();
                while (parent && parent->parentWidget()) {
                    if (parent == widget)
                        break;
                    parent = parent->parentWidget();
                }
                if (!childProxy->widget() || parent != widget)
                    continue;
                childProxy->setWidget(nullptr);
                delete childProxy;
            }
        }

        widget = nullptr;
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif
        q->setAcceptHoverEvents(false);
        if (!newWidget)
            q->update();
    }
    if (!newWidget)
        return;
    if (!newWidget->isWindow()) {
        const auto &extra = newWidget->parentWidget()->d_func()->extra;
        if (!extra || !extra->proxyWidget)  {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p "
                     "which is not a toplevel widget, and is not a child of an embedded widget", newWidget);
            return;
        }
    }

    // Register this proxy within the widget's private.
    // ### This is a bit backdoorish
    QWExtra *extra = newWidget->d_func()->extra.get();
    if (!extra) {
        newWidget->d_func()->createExtra();
        extra = newWidget->d_func()->extra.get();
    }
    QGraphicsProxyWidget **proxyWidget = &extra->proxyWidget;
    if (*proxyWidget) {
        if (*proxyWidget != q) {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p"
                        "; already embedded", newWidget);
        }
        return;
    }
    *proxyWidget = q;

    newWidget->setAttribute(Qt::WA_DontShowOnScreen);
    newWidget->ensurePolished();
    // Do not wait for this widget to close before the app closes ###
    // shouldn't this widget inherit the attribute?
    newWidget->setAttribute(Qt::WA_QuitOnClose, false);
    q->setAcceptHoverEvents(true);

    if (newWidget->testAttribute(Qt::WA_NoSystemBackground))
        q->setAttribute(Qt::WA_NoSystemBackground);
    if (newWidget->testAttribute(Qt::WA_OpaquePaintEvent))
        q->setAttribute(Qt::WA_OpaquePaintEvent);

    widget = newWidget;

    // Changes only go from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;

    if ((autoShow && !newWidget->testAttribute(Qt::WA_WState_ExplicitShowHide)) || !newWidget->testAttribute(Qt::WA_WState_Hidden)) {
        newWidget->show();
    }

    // Copy the state from the widget onto the proxy.
#ifndef QT_NO_CURSOR
    if (newWidget->testAttribute(Qt::WA_SetCursor))
        q->setCursor(widget->cursor());
#endif
    q->setEnabled(newWidget->isEnabled());
    q->setVisible(newWidget->isVisible());
    q->setLayoutDirection(newWidget->layoutDirection());
    if (newWidget->testAttribute(Qt::WA_SetStyle))
        q->setStyle(widget->style());

    resolveFont(inheritedFontResolveMask);
    resolvePalette(inheritedPaletteResolveMask);

    if (!newWidget->testAttribute(Qt::WA_Resized))
        newWidget->adjustSize();

    q->setContentsMargins(newWidget->contentsMargins());
    q->setWindowTitle(newWidget->windowTitle());

    // size policies and constraints..
    q->setSizePolicy(newWidget->sizePolicy());
    QSize sz = newWidget->minimumSize();
    q->setMinimumSize(sz.isNull() ? QSizeF() : QSizeF(sz));
    sz = newWidget->maximumSize();
    q->setMaximumSize(sz.isNull() ? QSizeF() : QSizeF(sz));

    updateProxyGeometryFromWidget();

    updateProxyInputMethodAcceptanceFromWidget();

    // Hook up the event filter to keep the state up to date.
    newWidget->installEventFilter(q);
    QObject::connect(newWidget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));

    // Changes no longer go only from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
}